

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall google::protobuf::Reflection::Swap(Reflection *this,Message *lhs,Message *rhs)

{
  Message *from;
  string *psVar1;
  MessageLite *this_00;
  LogMessage *pLVar2;
  Arena *pAVar3;
  Arena *arena;
  Metadata MVar4;
  Reflection *local_48 [2];
  Reflection *local_38;
  
  if (lhs == rhs) {
    return;
  }
  pAVar3 = (Arena *)(lhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  arena = (Arena *)(rhs->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  MVar4 = Message::GetMetadata(lhs);
  local_48[0] = MVar4.reflection;
  local_38 = this;
  psVar1 = absl::lts_20240722::log_internal::
           Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                     (local_48,&local_38,"lhs->GetReflection() == this");
  if (psVar1 == (string *)0x0) {
    MVar4 = Message::GetMetadata(rhs);
    local_48[0] = MVar4.reflection;
    local_38 = this;
    psVar1 = absl::lts_20240722::log_internal::
             Check_EQImpl<google::protobuf::Reflection_const*,google::protobuf::Reflection_const*>
                       (local_48,&local_38,"rhs->GetReflection() == this");
    if (psVar1 == (string *)0x0) {
      if (pAVar3 != arena) {
        from = lhs;
        if (pAVar3 != (Arena *)0x0) {
          arena = pAVar3;
          from = rhs;
          rhs = lhs;
        }
        this_00 = MessageLite::New(&rhs->super_MessageLite,arena);
        Message::MergeFrom((Message *)this_00,from);
        Message::CopyFrom(from,rhs);
        Swap(this,rhs,(Message *)this_00);
        return;
      }
      UnsafeArenaSwap(this,lhs,rhs);
      return;
    }
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x43d,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_48,
                        (char (*) [37])"Second argument to Swap() (of type \"");
    MVar4 = Message::GetMetadata(rhs);
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(string *)((MVar4.descriptor)->all_names_ + 1));
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [70])
                               "\") is not compatible with this reflection object (which is for type \""
                       );
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(string *)(this->descriptor_->all_names_ + 1));
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (pLVar2,(char (*) [79])
                      "\").  Note that the exact same class is required; not just the same descriptor."
              );
  }
  else {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_reflection.cc"
               ,0x435,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)local_48,(char (*) [36])"First argument to Swap() (of type \""
                       );
    MVar4 = Message::GetMetadata(lhs);
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(string *)((MVar4.descriptor)->all_names_ + 1));
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [70])
                               "\") is not compatible with this reflection object (which is for type \""
                       );
    pLVar2 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar2,(string *)(this->descriptor_->all_names_ + 1));
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (pLVar2,(char (*) [79])
                      "\").  Note that the exact same class is required; not just the same descriptor."
              );
  }
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_48);
}

Assistant:

void Reflection::Swap(Message* lhs, Message* rhs) const {
  if (lhs == rhs) return;

  Arena* lhs_arena = lhs->GetArena();
  Arena* rhs_arena = rhs->GetArena();

  // TODO:  Other Reflection methods should probably check this too.
  ABSL_CHECK_EQ(lhs->GetReflection(), this)
      << "First argument to Swap() (of type \""
      << lhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";
  ABSL_CHECK_EQ(rhs->GetReflection(), this)
      << "Second argument to Swap() (of type \""
      << rhs->GetDescriptor()->full_name()
      << "\") is not compatible with this reflection object (which is for type "
         "\""
      << descriptor_->full_name()
      << "\").  Note that the exact same class is required; not just the same "
         "descriptor.";

  // Check that both messages are in the same arena (or both on the heap). We
  // need to copy all data if not, due to ownership semantics.
  if (!internal::CanUseInternalSwap(lhs_arena, rhs_arena)) {
    // One of the two is guaranteed to have an arena.  Switch things around
    // to guarantee that lhs has an arena.
    Arena* arena = lhs_arena;
    if (arena == nullptr) {
      arena = rhs_arena;
      std::swap(lhs, rhs);  // Swapping names for pointers!
    }

    Message* temp = lhs->New(arena);
    temp->MergeFrom(*rhs);
    rhs->CopyFrom(*lhs);
    if (internal::DebugHardenForceCopyInSwap()) {
      lhs->CopyFrom(*temp);
      if (arena == nullptr) delete temp;
    } else {
      Swap(lhs, temp);
    }
    return;
  }

  UnsafeArenaSwap(lhs, rhs);
}